

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

bool __thiscall Inline::HasArgumentsAccess(Inline *this,Instr *instr,SymID argumentsSymId)

{
  Inline *this_00;
  Opnd *opnd;
  bool bVar1;
  OpndKind OVar2;
  Inline *this_01;
  
  this_00 = (Inline *)instr->m_dst;
  opnd = instr->m_src2;
  bVar1 = HasArgumentsAccess(this,instr->m_src1,argumentsSymId);
  if (bVar1) {
    return true;
  }
  bVar1 = HasArgumentsAccess(this,opnd,argumentsSymId);
  if (!bVar1) {
    if ((this_00 != (Inline *)0x0) &&
       (((this_01 = this_00, OVar2 = IR::Opnd::GetKind((Opnd *)this_00), OVar2 == OpndKindSym ||
         (this_01 = this_00, OVar2 = IR::Opnd::GetKind((Opnd *)this_00), OVar2 == OpndKindIndir)) &&
        (bVar1 = IsArgumentsOpnd(this_01,(Opnd *)this_00,argumentsSymId), bVar1)))) {
      return true;
    }
    return false;
  }
  return true;
}

Assistant:

bool
Inline::HasArgumentsAccess(IR::Instr * instr, SymID argumentsSymId)
{
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();

    // Super conservative here, if we see the arguments or any of its alias being used in any
    // other opcode just don't do this optimization.
    if (HasArgumentsAccess(src1, argumentsSymId) || HasArgumentsAccess(src2, argumentsSymId))
    {
        return true;
    }

    if (dst)
    {
        // For dst no need to check for RegOpnd
        if (dst->IsSymOpnd() || dst->IsIndirOpnd())
        {
            if (IsArgumentsOpnd(dst, argumentsSymId))
            {
                return true;
            }
        }
    }

    return false;
}